

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitNTest_random_view_Test<wchar_t>::WordSplitNTest_random_view_Test
          (WordSplitNTest_random_view_Test<wchar_t> *this)

{
  WordSplitNTest_random_view_Test<wchar_t> *this_local;
  
  WordSplitNTest<wchar_t>::WordSplitNTest(&this->super_WordSplitNTest<wchar_t>);
  *(undefined ***)&this->super_WordSplitNTest<wchar_t> =
       &PTR__WordSplitNTest_random_view_Test_00825f08;
  return;
}

Assistant:

TYPED_TEST(WordSplitNTest, random_view) {
	RandomWordTestData<TypeParam> data{};
	constexpr size_t n = 4;
	std::vector<std::basic_string_view<TypeParam>> split_result = word_split_n_view(data.m_str, default_delim<TypeParam>, n);

	// Tokens shall be same up until last one (n + 1)
	EXPECT_EQ(split_result.size(), n + 1);
	for (size_t index = 0; index != n; ++index) {
		EXPECT_EQ(split_result[index], data.m_tokens[index]);
	}

	EXPECT_EQ(split_result[n], data.get_remainder(n));
}